

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLException.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLException::loadExceptText(XMLException *this,Codes toLoad)

{
  uint uVar1;
  XMLMsgLoader *pXVar2;
  XMLCh *pXVar3;
  XMLCh local_1028 [4];
  XMLCh errText [2048];
  XMLSize_t msgSize;
  Codes toLoad_local;
  XMLException *this_local;
  
  this->fCode = toLoad;
  pXVar2 = gGetMsgLoader();
  uVar1 = (*pXVar2->_vptr_XMLMsgLoader[2])(pXVar2,(ulong)toLoad,local_1028,0x7ff);
  if ((uVar1 & 1) == 0) {
    pXVar3 = XMLString::replicate((XMLCh *)XMLUni::fgDefErrMsg,this->fMemoryManager);
    this->fMsg = pXVar3;
  }
  else {
    pXVar3 = XMLString::replicate(local_1028,this->fMemoryManager);
    this->fMsg = pXVar3;
  }
  return;
}

Assistant:

void XMLException::loadExceptText(const XMLExcepts::Codes toLoad)
{
    // Store the error code
    fCode = toLoad;

    // Load up the text into a local buffer
    const XMLSize_t msgSize = 2047;
    XMLCh errText[msgSize + 1];

    // load the text
	if (!gGetMsgLoader().loadMsg(toLoad, errText, msgSize))
	{
		fMsg = XMLString::replicate
        (
        XMLUni::fgDefErrMsg
            , fMemoryManager
        );
		return;
	}

    // We got the text so replicate it into the message member
    fMsg = XMLString::replicate(errText, fMemoryManager);
}